

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenFsmCond(Vec_Str_t *vCond,int nPis,int Prob)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  
  vCond->nSize = 0;
  if (0 < nPis) {
    do {
      uVar4 = Aig_ManRandom(0);
      if (Prob < (int)uVar4 % 100) {
        uVar4 = vCond->nCap;
        cVar3 = '-';
        if (vCond->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (vCond->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(vCond->pArray,0x10);
            }
            vCond->pArray = pcVar5;
            cVar3 = '-';
            goto LAB_002d0c2e;
          }
          sVar6 = (ulong)uVar4 * 2;
          if ((int)uVar4 < (int)sVar6) {
            if (vCond->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar6);
            }
            else {
              pcVar5 = (char *)realloc(vCond->pArray,sVar6);
            }
            vCond->pArray = pcVar5;
            cVar3 = '-';
            goto LAB_002d0c34;
          }
        }
      }
      else {
        uVar1 = vCond->nCap;
        if ((uVar4 & 1) == 0) {
          cVar3 = '0';
          if (vCond->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,0x10);
              }
              vCond->pArray = pcVar5;
              cVar3 = '0';
LAB_002d0c2e:
              sVar6 = 0x10;
            }
            else {
              sVar6 = (ulong)uVar1 * 2;
              if ((int)sVar6 <= (int)uVar1) goto LAB_002d0c37;
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar6);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,sVar6);
              }
              vCond->pArray = pcVar5;
              cVar3 = '0';
            }
LAB_002d0c34:
            vCond->nCap = (int)sVar6;
          }
        }
        else {
          cVar3 = '1';
          if (vCond->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,0x10);
              }
              vCond->pArray = pcVar5;
              cVar3 = '1';
              goto LAB_002d0c2e;
            }
            sVar6 = (ulong)uVar1 * 2;
            if ((int)uVar1 < (int)sVar6) {
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar6);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,sVar6);
              }
              vCond->pArray = pcVar5;
              cVar3 = '1';
              goto LAB_002d0c34;
            }
          }
        }
      }
LAB_002d0c37:
      iVar2 = vCond->nSize;
      vCond->nSize = iVar2 + 1;
      vCond->pArray[iVar2] = cVar3;
      nPis = nPis + -1;
    } while (nPis != 0);
  }
  uVar4 = vCond->nCap;
  if (vCond->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vCond->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vCond->pArray,0x10);
      }
      vCond->pArray = pcVar5;
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar4 * 2;
      if ((int)sVar6 <= (int)uVar4) goto LAB_002d0cea;
      if (vCond->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar6);
      }
      else {
        pcVar5 = (char *)realloc(vCond->pArray,sVar6);
      }
      vCond->pArray = pcVar5;
    }
    vCond->nCap = (int)sVar6;
  }
LAB_002d0cea:
  iVar2 = vCond->nSize;
  vCond->nSize = iVar2 + 1;
  vCond->pArray[iVar2] = '\0';
  return;
}

Assistant:

void Abc_GenFsmCond( Vec_Str_t * vCond, int nPis, int Prob )
{
    int i, Rand;
    Vec_StrClear( vCond );
    for ( i = 0; i < nPis; i++ )
    {
        Rand = Aig_ManRandom( 0 );
        if ( Rand % 100 > Prob )
            Vec_StrPush( vCond, '-' );
        else if ( Rand & 1 )
            Vec_StrPush( vCond, '1' );
        else
            Vec_StrPush( vCond, '0' );
    }
    Vec_StrPush( vCond, '\0' );
}